

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O0

Seq __thiscall xt::LSeq::next(LSeq *this)

{
  bool bVar1;
  element_type *peVar2;
  LSeq *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_RSI;
  Seq SVar4;
  shared_ptr<xt::_List> local_28;
  LSeq *this_local;
  
  this_local = this;
  peVar2 = std::__shared_ptr_access<xt::_List,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<xt::_List,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      (in_RSI + 8));
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar2->rest);
  if (bVar1) {
    this_00 = (LSeq *)operator_new(0x18);
    peVar2 = std::__shared_ptr_access<xt::_List,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<xt::_List,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        (in_RSI + 8));
    std::shared_ptr<xt::_List>::shared_ptr(&local_28,&peVar2->rest);
    LSeq(this_00,&local_28);
    std::shared_ptr<xt::ISeq>::shared_ptr<xt::LSeq,void>((shared_ptr<xt::ISeq> *)this,this_00);
    std::shared_ptr<xt::_List>::~shared_ptr(&local_28);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    std::shared_ptr<xt::ISeq>::shared_ptr((shared_ptr<xt::ISeq> *)this);
    _Var3._M_pi = extraout_RDX_00;
  }
  SVar4.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  SVar4.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_ISeq;
  return (Seq)SVar4.super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Seq LSeq::next() const { if (l->rest) return Seq(new LSeq(l->rest)); return Seq(); }